

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O0

Float __thiscall pbrt::MIPMap::Bilerp<float>(MIPMap *this,int level,Point2f st)

{
  WrapMode2D wrapMode;
  int iVar1;
  size_t sVar2;
  int in_ESI;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *in_RDI;
  Float FVar3;
  undefined1 in_ZMM0 [64];
  Image *unaff_retaddr;
  WrapMode2D in_stack_00000008;
  Tuple2<pbrt::Point2,_float> in_stack_00000010;
  undefined8 in_stack_ffffffffffffff38;
  WrapMode w;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  char (*in_stack_ffffffffffffff70) [37];
  Image *in_stack_ffffffffffffff78;
  WrapMode in_stack_ffffffffffffff80;
  WrapMode in_stack_ffffffffffffff84;
  Tuple2<pbrt::Point2,_float> in_stack_ffffffffffffff88;
  LogLevel in_stack_ffffffffffffff94;
  int in_stack_fffffffffffffffc;
  
  w = (WrapMode)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  vmovlpd_avx(in_ZMM0._0_16_);
  if (-1 < in_ESI) {
    sVar2 = pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::size(in_RDI);
    if ((ulong)(long)in_ESI < sVar2) {
      pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator[]
                (in_RDI,(long)in_ESI);
      iVar1 = Image::NChannels((Image *)0x8d4238);
      if (iVar1 == 1) {
        pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator[]
                  (in_RDI,(long)in_ESI);
        WrapMode2D::WrapMode2D
                  ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),w);
        FVar3 = Image::BilerpChannel
                          (unaff_retaddr,(Point2f)in_stack_00000010,in_stack_fffffffffffffffc,
                           in_stack_00000008);
      }
      else if (iVar1 == 3) {
        pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator[]
                  (in_RDI,(long)in_ESI);
        WrapMode2D::WrapMode2D
                  ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),w);
        wrapMode.wrap.values[1] = in_stack_ffffffffffffff84;
        wrapMode.wrap.values[0] = in_stack_ffffffffffffff80;
        Image::Bilerp(in_stack_ffffffffffffff78,(Point2f)in_stack_ffffffffffffff88,wrapMode);
        FVar3 = ImageChannelValues::Average
                          ((ImageChannelValues *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x8d434f);
      }
      else {
        if (iVar1 != 4) {
          pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator[]
                    (in_RDI,(long)in_ESI);
          Image::NChannels((Image *)0x8d43e7);
          LogFatal<int>(in_stack_ffffffffffffff94,(char *)in_stack_ffffffffffffff88,
                        in_stack_ffffffffffffff84,(char *)in_stack_ffffffffffffff78,
                        (int *)in_stack_ffffffffffffff70);
        }
        pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator[]
                  (in_RDI,(long)in_ESI);
        WrapMode2D::WrapMode2D
                  ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),w);
        FVar3 = Image::BilerpChannel
                          (unaff_retaddr,(Point2f)in_stack_00000010,in_stack_fffffffffffffffc,
                           in_stack_00000008);
      }
      return FVar3;
    }
  }
  LogFatal<char_const(&)[37]>
            (in_stack_ffffffffffffff94,(char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
             (char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
}

Assistant:

Float MIPMap::Bilerp(int level, Point2f st) const {
    CHECK(level >= 0 && level < pyramid.size());
    switch (pyramid[level].NChannels()) {
    case 1:
        return pyramid[level].BilerpChannel(st, 0, wrapMode);
    case 3:
        return pyramid[level].Bilerp(st, wrapMode).Average();
    case 4:
        // Return alpha
        return pyramid[level].BilerpChannel(st, 3, wrapMode);
    default:
        LOG_FATAL("Unexpected number of image channels: %d", pyramid[level].NChannels());
    }
}